

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.h
# Opt level: O2

Index __thiscall wabt::BindingHash::FindIndex(BindingHash *this,string_view name)

{
  Index IVar1;
  string_view local_40;
  string local_30;
  
  local_40.size_ = name.size_;
  local_40.data_ = name.data_;
  string_view::to_string_abi_cxx11_(&local_30,&local_40);
  IVar1 = FindIndex(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return IVar1;
}

Assistant:

Index FindIndex(string_view name) const {
    return FindIndex(name.to_string());
  }